

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenio::save_poly(tetgenio *this,char *filebasename)

{
  facet *pfVar1;
  polygon *ppVar2;
  facet *pfVar3;
  double *pdVar4;
  FILE *__stream;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  char outpolyfilename [1024];
  
  sprintf(outpolyfilename,"%s.poly",filebasename);
  printf("Saving poly to %s\n",outpolyfilename);
  __stream = fopen(outpolyfilename,"w");
  fprintf(__stream,"%d  %d  %d  %d\n",0,(ulong)(uint)this->mesh_dim,
          (ulong)(uint)this->numberofpointattributes,(ulong)(this->pointmarkerlist != (int *)0x0));
  if (this->mesh_dim == 2) {
    fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberofedges,
            (ulong)(this->edgemarkerlist != (int *)0x0));
    for (lVar8 = 0; lVar8 < this->numberofedges; lVar8 = lVar8 + 1) {
      fprintf(__stream,"%d  %4d  %4d",(ulong)(uint)(this->firstnumber + (int)lVar8),
              (ulong)(uint)this->edgelist[lVar8 * 2],(ulong)(uint)this->edgelist[lVar8 * 2 + 1]);
      if (this->edgemarkerlist != (int *)0x0) {
        fprintf(__stream,"  %d",(ulong)(uint)this->edgemarkerlist[lVar8]);
      }
      fputc(10,__stream);
    }
  }
  else {
    fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberoffacets,
            (ulong)(this->facetmarkerlist != (int *)0x0));
    for (lVar8 = 0; lVar8 < this->numberoffacets; lVar8 = lVar8 + 1) {
      if (this->facetmarkerlist == (int *)0x0) {
        uVar7 = 0;
      }
      else {
        uVar7 = (ulong)(uint)this->facetmarkerlist[lVar8];
      }
      pfVar3 = this->facetlist;
      pfVar1 = pfVar3 + lVar8;
      fprintf(__stream,"%d  %d  %d  # %d\n",(ulong)(uint)pfVar3[lVar8].numberofpolygons,
              (ulong)(uint)pfVar3[lVar8].numberofholes,uVar7,
              (ulong)(uint)(this->firstnumber + (int)lVar8));
      for (lVar9 = 0; lVar9 < pfVar1->numberofpolygons; lVar9 = lVar9 + 1) {
        ppVar2 = pfVar1->polygonlist + lVar9;
        fprintf(__stream,"%d  ",(ulong)(uint)pfVar1->polygonlist[lVar9].numberofvertices);
        uVar10 = 1;
        lVar6 = 0;
        while( true ) {
          if (ppVar2->numberofvertices <= lVar6) break;
          if ((uVar10 / 10) * 10 + -1 == (int)lVar6) {
            fwrite("\n  ",3,1,__stream);
          }
          fprintf(__stream,"  %d",(ulong)(uint)ppVar2->vertexlist[lVar6]);
          uVar10 = uVar10 + 1;
          lVar6 = lVar6 + 1;
        }
        fputc(10,__stream);
      }
      lVar9 = 0x10;
      for (lVar6 = 0; lVar6 < pfVar1->numberofholes; lVar6 = lVar6 + 1) {
        pdVar4 = pfVar1->holelist;
        fprintf(__stream,"%d  %.12g  %.12g  %.12g\n",*(undefined8 *)((long)pdVar4 + lVar9 + -0x10),
                *(undefined8 *)((long)pdVar4 + lVar9 + -8),*(undefined8 *)((long)pdVar4 + lVar9),
                (ulong)(uint)(this->firstnumber + (int)lVar6));
        lVar9 = lVar9 + 0x18;
      }
    }
  }
  fprintf(__stream,"%d\n",(ulong)(uint)this->numberofholes);
  lVar8 = 0x10;
  for (lVar9 = 0; lVar9 < this->numberofholes; lVar9 = lVar9 + 1) {
    lVar6 = (long)this->mesh_dim * (long)(int)lVar9;
    fprintf(__stream,"%d  %.12g  %.12g",this->holelist[lVar6],this->holelist[lVar6 + 1],
            (ulong)(uint)(this->firstnumber + (int)lVar9));
    if (this->mesh_dim == 3) {
      fprintf(__stream,"  %.12g",*(undefined8 *)((long)this->holelist + lVar8));
    }
    fputc(10,__stream);
    lVar8 = lVar8 + 0x18;
  }
  lVar9 = 0;
  fprintf(__stream,"%d\n",(ulong)(uint)this->numberofregions);
  lVar6 = 0;
  for (lVar8 = 0; lVar8 < this->numberofregions; lVar8 = lVar8 + 1) {
    lVar5 = (ulong)(uint)this->firstnumber + lVar8;
    pdVar4 = this->regionlist;
    if (this->mesh_dim == 2) {
      fprintf(__stream,"%d  %.12g  %.12g  %.12g  %.12g\n",*(undefined8 *)((long)pdVar4 + lVar9),
              *(undefined8 *)((long)pdVar4 + lVar9 + 8),*(undefined8 *)((long)pdVar4 + lVar9 + 0x10)
              ,*(undefined8 *)((long)pdVar4 + lVar9 + 0x18),lVar5);
    }
    else {
      fprintf(__stream,"%d  %.12g  %.12g  %.12g  %.12g  %.12g\n",
              *(undefined8 *)((long)pdVar4 + lVar6),*(undefined8 *)((long)pdVar4 + lVar6 + 8),
              *(undefined8 *)((long)pdVar4 + lVar6 + 0x10),
              *(undefined8 *)((long)pdVar4 + lVar6 + 0x18),
              *(undefined8 *)((long)pdVar4 + lVar6 + 0x20),lVar5);
    }
    lVar6 = lVar6 + 0x28;
    lVar9 = lVar9 + 0x20;
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_poly(char* filebasename)
{
  FILE *fout;
  facet *f;
  polygon *p;
  char outpolyfilename[FILENAMESIZE];
  int i, j, k;

  sprintf(outpolyfilename, "%s.poly", filebasename);
  printf("Saving poly to %s\n", outpolyfilename);
  fout = fopen(outpolyfilename, "w");

  // The zero indicates that the vertices are in a separate .node file.
  //   Followed by number of dimensions, number of vertex attributes,
  //   and number of boundary markers (zero or one).
  fprintf(fout, "%d  %d  %d  %d\n", 0, mesh_dim, numberofpointattributes,
          pointmarkerlist != NULL ? 1 : 0);

  // Save segments or facets.
  if (mesh_dim == 2) {
    // Number of segments, number of boundary markers (zero or one).
    fprintf(fout, "%d  %d\n", numberofedges, edgemarkerlist != NULL ? 1 : 0);
    for (i = 0; i < numberofedges; i++) {
      fprintf(fout, "%d  %4d  %4d", i + firstnumber, edgelist[i * 2],
              edgelist[i * 2 + 1]);
      if (edgemarkerlist != NULL) {
        fprintf(fout, "  %d", edgemarkerlist[i]);
      }
      fprintf(fout, "\n");
    }
  } else {
    // Number of facets, number of boundary markers (zero or one).
    fprintf(fout, "%d  %d\n", numberoffacets, facetmarkerlist != NULL ? 1 : 0);
    for (i = 0; i < numberoffacets; i++) {
      f = &(facetlist[i]);
      fprintf(fout, "%d  %d  %d  # %d\n", f->numberofpolygons,f->numberofholes,
            facetmarkerlist != NULL ? facetmarkerlist[i] : 0, i + firstnumber);
      // Output polygons of this facet.
      for (j = 0; j < f->numberofpolygons; j++) {
        p = &(f->polygonlist[j]);
        fprintf(fout, "%d  ", p->numberofvertices);
        for (k = 0; k < p->numberofvertices; k++) {
          if (((k + 1) % 10) == 0) {
            fprintf(fout, "\n  ");
          }
          fprintf(fout, "  %d", p->vertexlist[k]);
        }
        fprintf(fout, "\n");
      }
      // Output holes of this facet.
      for (j = 0; j < f->numberofholes; j++) {
        fprintf(fout, "%d  %.12g  %.12g  %.12g\n", j + firstnumber,
           f->holelist[j * 3], f->holelist[j * 3 + 1], f->holelist[j * 3 + 2]);
      }
    }
  }

  // Save holes.
  fprintf(fout, "%d\n", numberofholes);
  for (i = 0; i < numberofholes; i++) {
    // Output x, y coordinates.
    fprintf(fout, "%d  %.12g  %.12g", i + firstnumber, holelist[i * mesh_dim],
            holelist[i * mesh_dim + 1]);
    if (mesh_dim == 3) {
      // Output z coordinate.
      fprintf(fout, "  %.12g", holelist[i * mesh_dim + 2]);
    }
    fprintf(fout, "\n");
  }

  // Save regions.
  fprintf(fout, "%d\n", numberofregions);
  for (i = 0; i < numberofregions; i++) {
    if (mesh_dim == 2) {
      // Output the index, x, y coordinates, attribute (region number)
      //   and maximum area constraint (maybe -1).
      fprintf(fout, "%d  %.12g  %.12g  %.12g  %.12g\n", i + firstnumber,
              regionlist[i * 4], regionlist[i * 4 + 1],
              regionlist[i * 4 + 2], regionlist[i * 4 + 3]);
    } else {
      // Output the index, x, y, z coordinates, attribute (region number)
      //   and maximum volume constraint (maybe -1).
      fprintf(fout, "%d  %.12g  %.12g  %.12g  %.12g  %.12g\n", i + firstnumber,
              regionlist[i * 5], regionlist[i * 5 + 1],
              regionlist[i * 5 + 2], regionlist[i * 5 + 3],
              regionlist[i * 5 + 4]);
    }
  }

  fclose(fout);  
}